

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

secp256k1_context * secp256k1_context_preallocated_create(void *prealloc,uint flags)

{
  char cVar1;
  char cVar2;
  void *prealloc_00;
  secp256k1_context *psVar3;
  long lVar4;
  secp256k1_gej *extraout_RDX;
  secp256k1_gej *psVar5;
  secp256k1_gej *extraout_RDX_00;
  secp256k1_gej *extraout_RDX_01;
  secp256k1_gej *extraout_RDX_02;
  uint flags_00;
  uchar *p1;
  secp256k1_ge_storage *psVar6;
  uint64_t *puVar7;
  char *__src;
  int iVar8;
  bool bVar9;
  byte bVar10;
  uchar out [32];
  secp256k1_gej gj;
  undefined1 local_128 [128];
  undefined1 local_a8 [64];
  void *pvStack_68;
  _func_void_char_ptr_void_ptr *local_60;
  void *local_58;
  uint32_t local_50 [12];
  
  bVar10 = 0;
  psVar3 = (secp256k1_context *)local_128;
  local_a8._0_8_ = 0xbb67ae856a09e667;
  local_a8._8_8_ = 0xa54ff53a3c6ef372;
  local_a8._16_8_ = 0x9b05688c510e527f;
  local_a8._24_8_ = 0x5be0cd191f83d9ab;
  local_50[2] = 0;
  local_50[3] = 0;
  secp256k1_sha256_write
            ((secp256k1_sha256 *)local_a8,
             (uchar *)"For this sample, this 63-byte string will be used as input data",0x3f);
  secp256k1_sha256_finalize((secp256k1_sha256 *)local_a8,local_128);
  lVar4 = 0;
  psVar5 = extraout_RDX;
  do {
    cVar1 = local_128[lVar4];
    psVar5 = (secp256k1_gej *)CONCAT71((int7)((ulong)psVar5 >> 8),cVar1);
    cVar2 = (&secp256k1_selftest_sha256_output32)[lVar4];
    psVar3 = (secp256k1_context *)CONCAT71((int7)((ulong)psVar3 >> 8),cVar2);
    if (cVar1 != cVar2) break;
    bVar9 = lVar4 != 0x1f;
    lVar4 = lVar4 + 1;
  } while (bVar9);
  if (cVar1 == cVar2) {
    if ((char)flags == '\x01') {
      *(secp256k1_callback *)((long)prealloc + 0xb8) = default_illegal_callback;
      *(secp256k1_callback *)((long)prealloc + 200) = default_error_callback;
      *(undefined8 *)prealloc = 0;
      *(undefined8 *)((long)prealloc + 8) = 0;
      *(undefined8 *)((long)prealloc + 0x10) = 0;
      if ((flags >> 9 & 1) != 0) {
        *(secp256k1_ge_storage (**) [16])((long)prealloc + 0x10) = secp256k1_ecmult_static_context;
        secp256k1_ecmult_gen_blind
                  ((secp256k1_ecmult_gen_context *)((long)prealloc + 0x10),(uchar *)0x0);
        psVar5 = extraout_RDX_00;
      }
      if (((flags >> 8 & 1) != 0) && (*prealloc == 0)) {
        local_50[8] = 0;
        local_a8._0_8_ = 0x2815b16f81798;
        local_a8._8_8_ = 0xdb2dce28d959f;
        local_a8._16_8_ = 0xe870b07029bfc;
        local_a8._24_8_ = 0xbbac55a06295c;
        local_a8._32_8_ = 0x79be667ef9dc;
        local_a8._40_8_ = 0x7d08ffb10d4b8;
        local_a8._48_8_ = 0x48a68554199c4;
        local_a8._56_8_ = 0xe1108a8fd17b4;
        pvStack_68 = (void *)0xc4655da4fbfc0;
        local_60 = (_func_void_char_ptr_void_ptr *)0x483ada7726a3;
        local_58 = (void *)0x1;
        local_50[0] = 0;
        local_50[1] = 0;
        local_50[2] = 0;
        local_50[3] = 0;
        local_50[4] = 0;
        local_50[5] = 0;
        local_50[6] = 0;
        local_50[7] = 0;
        *(long *)prealloc = (long)prealloc + 0xe0;
        secp256k1_ecmult_odd_multiples_table_storage_var
                  ((int)((long)prealloc + 0xe0),(secp256k1_ge_storage *)local_a8,psVar5);
        *(long *)((long)prealloc + 8) = (long)prealloc + 0x800e0;
        psVar6 = (secp256k1_ge_storage *)local_a8;
        puVar7 = (uint64_t *)local_128;
        for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
          *puVar7 = (psVar6->x).n[0];
          psVar6 = (secp256k1_ge_storage *)((long)psVar6 + (ulong)bVar10 * -0x10 + 8);
          puVar7 = puVar7 + (ulong)bVar10 * -2 + 1;
        }
        iVar8 = 0x80;
        psVar5 = extraout_RDX_01;
        do {
          if (local_128._120_4_ == 0) {
            secp256k1_gej_double((secp256k1_gej *)local_128,(secp256k1_gej *)local_128);
            psVar5 = extraout_RDX_02;
          }
          else {
            local_128._120_4_ = 1;
          }
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
        secp256k1_ecmult_odd_multiples_table_storage_var
                  ((int)*(undefined8 *)((long)prealloc + 8),(secp256k1_ge_storage *)local_128,psVar5
                  );
      }
      *(uint *)((long)prealloc + 0xd8) = flags >> 10 & 1;
      return (secp256k1_context *)prealloc;
    }
    secp256k1_context_preallocated_create_cold_1();
  }
  __src = "self test failed";
  secp256k1_default_error_callback_fn("self test failed",psVar3);
  if ((char)__src == '\x01') {
    flags_00 = (uint)__src;
    __src = (char *)((ulong)((flags_00 & 0x100) << 0xc) | 0xe0);
    prealloc_00 = malloc((size_t)__src);
    if (prealloc_00 != (void *)0x0) {
      psVar3 = secp256k1_context_preallocated_create(prealloc_00,flags_00);
      return psVar3;
    }
  }
  else {
    secp256k1_context_create_cold_1();
  }
  secp256k1_context_create_cold_2();
  if (psVar3 == (secp256k1_context *)0x0) {
    secp256k1_context_preallocated_clone_cold_1();
  }
  else {
    memcpy(psVar3,__src,(ulong)(*(long *)__src != 0) << 0x14 | 0xe0);
    if (*(long *)__src != 0) {
      (psVar3->ecmult_ctx).pre_g =
           (secp256k1_ge_storage_0_ *)((*(long *)__src - (long)__src) + (long)psVar3);
    }
    if (*(long *)((long)__src + 8) != 0) {
      (psVar3->ecmult_ctx).pre_g_128 =
           (secp256k1_ge_storage_0_ *)((*(long *)((long)__src + 8) - (long)__src) + (long)psVar3);
    }
  }
  return psVar3;
}

Assistant:

secp256k1_context* secp256k1_context_preallocated_create(void* prealloc, unsigned int flags) {
    void* const base = prealloc;
    size_t prealloc_size;
    secp256k1_context* ret;

    if (!secp256k1_selftest()) {
        secp256k1_callback_call(&default_error_callback, "self test failed");
    }

    prealloc_size = secp256k1_context_preallocated_size(flags);
    if (prealloc_size == 0) {
        return NULL;
    }
    VERIFY_CHECK(prealloc != NULL);
    ret = (secp256k1_context*)manual_alloc(&prealloc, sizeof(secp256k1_context), base, prealloc_size);
    ret->illegal_callback = default_illegal_callback;
    ret->error_callback = default_error_callback;

    secp256k1_ecmult_context_init(&ret->ecmult_ctx);
    secp256k1_ecmult_gen_context_init(&ret->ecmult_gen_ctx);

    /* Flags have been checked by secp256k1_context_preallocated_size. */
    VERIFY_CHECK((flags & SECP256K1_FLAGS_TYPE_MASK) == SECP256K1_FLAGS_TYPE_CONTEXT);
    if (flags & SECP256K1_FLAGS_BIT_CONTEXT_SIGN) {
        secp256k1_ecmult_gen_context_build(&ret->ecmult_gen_ctx, &prealloc);
    }
    if (flags & SECP256K1_FLAGS_BIT_CONTEXT_VERIFY) {
        secp256k1_ecmult_context_build(&ret->ecmult_ctx, &prealloc);
    }
    ret->declassify = !!(flags & SECP256K1_FLAGS_BIT_CONTEXT_DECLASSIFY);

    return (secp256k1_context*) ret;
}